

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ArrayPtr<unsigned_char> __thiscall kj::VectorOutputStream::getWriteBuffer(VectorOutputStream *this)

{
  size_t sVar1;
  ArrayPtr<unsigned_char> AVar2;
  
  sVar1 = (this->vector).size_;
  if (this->fillPos == (this->vector).ptr + sVar1) {
    grow(this,sVar1 + 1);
  }
  AVar2.size_ = (this->vector).ptr + ((this->vector).size_ - (long)this->fillPos);
  AVar2.ptr = this->fillPos;
  return AVar2;
}

Assistant:

ArrayPtr<byte> VectorOutputStream::getWriteBuffer() {
  // Grow if needed.
  if (fillPos == vector.end()) {
    grow(vector.size() + 1);
  }

  return arrayPtr(fillPos, vector.end());
}